

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O3

int log_map_insert(log_map map,char *key,void *value)

{
  log_map_bucket *pplVar1;
  size_t *psVar2;
  log_map_bucket_conflict plVar3;
  int iVar4;
  ulong uVar5;
  log_map_bucket_conflict plVar6;
  ulong uVar7;
  char cVar8;
  char *pcVar9;
  log_map_bucket plVar10;
  
  uVar5 = 0x811c9dc5;
  cVar8 = *key;
  if (cVar8 != '\0') {
    pcVar9 = key + 1;
    do {
      uVar5 = (long)cVar8 ^ uVar5 * 0x1000193;
      cVar8 = *pcVar9;
      pcVar9 = pcVar9 + 1;
    } while (cVar8 != '\0');
  }
  plVar3 = (map->table).data + ((map->table).size - 1 & uVar5);
  plVar10 = plVar3;
  if (plVar3->key == (char *)0x0) {
    psVar2 = &(map->table).count;
    *psVar2 = *psVar2 + 1;
    plVar3->key = key;
    plVar3->value = value;
    plVar3->next = (log_map_bucket)0x0;
  }
  else {
    do {
      iVar4 = strcmp(plVar10->key,key);
      if (iVar4 == 0) {
        plVar10->value = value;
        return 0;
      }
      pplVar1 = &plVar10->next;
      plVar10 = *pplVar1;
    } while (*pplVar1 != (log_map_bucket)0x0);
    psVar2 = &(map->table).count;
    *psVar2 = *psVar2 + 1;
    uVar5 = (map->block).count;
    uVar7 = (map->block).position;
    if (0xff < uVar7) {
      if ((map->block).size <= uVar5) {
        return 1;
      }
      plVar6 = (log_map_bucket_conflict)malloc(0x1800);
      if (plVar6 == (log_map_bucket_conflict)0x0) {
        return 1;
      }
      (map->block).data[uVar5] = plVar6;
      uVar5 = uVar5 + 1;
      (map->block).count = uVar5;
      uVar7 = 0;
    }
    plVar10 = (map->block).data[uVar5 - 1] + uVar7;
    plVar10->key = key;
    plVar10->value = value;
    plVar10->next = plVar3->next;
    plVar3->next = plVar10;
    (map->block).position = uVar7 + 1;
  }
  return 0;
}

Assistant:

int log_map_insert(log_map map, const char *key, const void *value)
{
	size_t hash = log_map_hash_fnv1(key) & (map->table.size - 1);

	log_map_bucket head = &map->table.data[hash];

	log_map_bucket bucket = head;

	if (head->key != NULL)
	{
		do
		{
			if (strcmp(bucket->key, key) == 0)
			{
				bucket->value = value;

				return 0;
			}

			bucket = bucket->next;

		} while (bucket != NULL);
	}

	++map->table.count;

	if (head->key == NULL)
	{
		head->key = key;
		head->value = value;
		head->next = NULL;

		return 0;
	}

	if (map->block.position >= LOG_MAP_BUCKET_SIZE)
	{
		log_map_bucket buckets = NULL;

		if (map->block.count >= map->block.size)
		{
			return 1;
		}

		buckets = malloc(sizeof(struct log_map_bucket_type) * LOG_MAP_BUCKET_SIZE);

		if (buckets == NULL)
		{
			return 1;
		}

		map->block.data[map->block.count] = buckets;

		map->block.position = 0;

		++map->block.count;
	}

	bucket = map->block.data[map->block.count - 1] + map->block.position;

	bucket->key = key;
	bucket->value = value;
	bucket->next = head->next;
	head->next = bucket;

	++map->block.position;

	return 0;
}